

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_dump.cpp
# Opt level: O0

XrResult ApiDumpLayerXrCreateApiLayerInstance
                   (XrInstanceCreateInfo *info,XrApiLayerCreateInfo *apiLayerInfo,
                   XrInstance *instance)

{
  void *value;
  PFN_xrGetInstanceProcAddr get_inst_proc_addr;
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  invalid_argument *piVar8;
  ostream *poVar9;
  XrGeneratedDispatchTable *table;
  mapped_type *ppXVar10;
  undefined1 local_cb8 [8];
  unique_lock<std::mutex> mlock;
  XrGeneratedDispatchTable *next_dispatch;
  XrInstance pXStack_c98;
  XrResult result;
  XrInstance returned_instance;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c78 [32];
  __cxx11 local_c58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c38 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c18 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf8 [8];
  string prefix_1;
  uint local_bd4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0 [4];
  uint32_t ii;
  ostringstream local_bb0 [8];
  ostringstream oss_enabledExtensionNames_array;
  string local_a38 [8];
  string enabledextensionnames_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18 [32];
  ostringstream local_9f8 [8];
  ostringstream oss_enabledExtensionCount;
  string local_880 [8];
  string enabledextensioncount_prefix;
  __cxx11 local_860 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800 [8];
  string prefix;
  uint local_7dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8 [4];
  uint32_t i;
  ostringstream local_7b8 [8];
  ostringstream oss_enabledApiLayerNames_array;
  string local_640 [8];
  string enabledapilayernames_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620 [32];
  ostringstream local_600 [8];
  ostringstream oss_enabledApiLayerCount;
  string local_488 [8];
  string enabledapilayercount_prefix;
  allocator local_461;
  string local_460 [32];
  string local_440 [32];
  string local_420 [8];
  string applicationinfo_prefix;
  __cxx11 local_400 [32];
  string local_3e0 [8];
  string flags_prefix;
  string local_3c0 [32];
  string local_3a0 [8];
  string next_prefix;
  __cxx11 local_380 [39];
  allocator local_359;
  string local_358 [8];
  string info_prefix;
  undefined1 local_338 [40];
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  string local_2d0 [8];
  string export_type_lower;
  string local_2b0 [8];
  string file_name;
  string local_280 [8];
  string export_type;
  undefined1 local_258 [7];
  bool first_time;
  XrApiLayerCreateInfo new_api_layer_info;
  PFN_xrCreateApiLayerInstance next_create_api_layer_instance;
  PFN_xrGetInstanceProcAddr next_get_instance_proc_addr;
  XrInstance *instance_local;
  XrApiLayerCreateInfo *apiLayerInfo_local;
  XrInstanceCreateInfo *info_local;
  
  new_api_layer_info.nextInfo = (XrApiLayerNextInfo *)0x0;
  memset(local_258,0,0x220);
  bVar1 = g_record_info.initialized ^ 0xff;
  if ((g_record_info.initialized & 1U) == 0) {
    g_record_info.initialized = true;
    g_record_info.type = RECORD_TEXT_COUT;
  }
  PlatformUtilsGetEnv_abi_cxx11_((char *)local_280);
  PlatformUtilsGetEnv_abi_cxx11_((char *)local_2b0);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::operator=((string *)&g_record_info.file_name,local_2b0);
    g_record_info.type = RECORD_TEXT_FILE;
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::string(local_2d0,local_280);
    uVar5 = std::__cxx11::string::begin();
    uVar6 = std::__cxx11::string::end();
    uVar7 = std::__cxx11::string::begin();
    std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,ApiDumpLayerXrCreateApiLayerInstance(XrInstanceCreateInfo_const*,XrApiLayerCreateInfo_const*,XrInstance_T**)::__0>
              (uVar5,uVar6,uVar7);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2d0,"text");
    if (bVar2) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        g_record_info.type = RECORD_TEXT_FILE;
      }
      else {
        g_record_info.type = RECORD_TEXT_COUT;
      }
LAB_001059f4:
      contents.
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2d0,"html");
      if ((!bVar2) || ((bVar1 & 1) == 0)) {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2d0,"code");
        if (bVar2) {
          g_record_info.type = RECORD_CODE_FILE;
        }
        goto LAB_001059f4;
      }
      g_record_info.type = RECORD_HTML_FILE;
      bVar2 = ApiDumpLayerWriteHtmlHeader();
      if (bVar2) goto LAB_001059f4;
      info_local._4_4_ = XR_ERROR_INITIALIZATION_FAILED;
      contents.
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    std::__cxx11::string::~string(local_2d0);
    if (contents.
        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_00106b44;
  }
  if ((((((apiLayerInfo == (XrApiLayerCreateInfo *)0x0) ||
         (apiLayerInfo->structType != XR_LOADER_INTERFACE_STRUCT_API_LAYER_CREATE_INFO)) ||
        (apiLayerInfo->structVersion == 0)) ||
       ((apiLayerInfo->structSize < 0x220 || (apiLayerInfo->nextInfo == (XrApiLayerNextInfo *)0x0)))
       ) || ((apiLayerInfo->nextInfo->structType != XR_LOADER_INTERFACE_STRUCT_API_LAYER_NEXT_INFO
             || ((apiLayerInfo->nextInfo->structVersion == 0 ||
                 (apiLayerInfo->nextInfo->structSize < 0x128)))))) ||
     ((iVar3 = strcmp("XR_APILAYER_LUNARG_api_dump",apiLayerInfo->nextInfo->layerName), iVar3 != 0
      || ((apiLayerInfo->nextInfo->nextGetInstanceProcAddr == (PFN_xrGetInstanceProcAddr)0x0 ||
          (apiLayerInfo->nextInfo->nextCreateApiLayerInstance == (PFN_xrCreateApiLayerInstance)0x0))
         )))) {
    info_local._4_4_ = XR_ERROR_INITIALIZATION_FAILED;
    contents.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_338 + 0x20));
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[17],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)(local_338 + 0x20),(char (*) [9])"XrResult",(char (*) [17])"xrCreateInstance",
               (char (*) [1])0x2ffb54);
    PointerToHexString<XrInstanceCreateInfo>((XrInstanceCreateInfo *)local_338);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[28],char_const(&)[5],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)(local_338 + 0x20),(char (*) [28])"const XrInstanceCreateInfo*",
               (char (*) [5])"info",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
    std::__cxx11::string::~string((string *)local_338);
    if (info != (XrInstanceCreateInfo *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_358,"info->",&local_359);
      std::allocator<char>::~allocator((allocator<char> *)&local_359);
      std::__cxx11::to_string(local_380,info->type);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[16],char_const(&)[11],std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)(local_338 + 0x20),(char (*) [16])"XrStructureType",(char (*) [11])"info->type",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380);
      std::__cxx11::string::~string((string *)local_380);
      std::__cxx11::string::string(local_3a0,local_358);
      std::__cxx11::string::operator+=(local_3a0,"next");
      value = info->next;
      std::__cxx11::string::string(local_3c0,local_3a0);
      bVar2 = ApiDumpDecodeNextChain
                        ((XrGeneratedDispatchTable *)0x0,value,(string *)local_3c0,
                         (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(local_338 + 0x20));
      std::__cxx11::string::~string(local_3c0);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar8,"Invalid Operation");
        __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      std::__cxx11::string::string(local_3e0,local_358);
      std::__cxx11::string::operator+=(local_3e0,"createFlags");
      std::__cxx11::to_string(local_400,info->createFlags);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[22],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)(local_338 + 0x20),(char (*) [22])"XrInstanceCreateFlags",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_400);
      std::__cxx11::string::~string((string *)local_400);
      std::__cxx11::string::string(local_420,local_358);
      std::__cxx11::string::operator+=(local_420,"applicationInfo");
      std::__cxx11::string::string(local_440,local_420);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_460,"XrApplicationInfo",&local_461);
      bVar2 = ApiDumpOutputXrStruct
                        ((XrGeneratedDispatchTable *)0x0,&info->applicationInfo,(string *)local_440,
                         (string *)local_460,true,
                         (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(local_338 + 0x20));
      std::__cxx11::string::~string(local_460);
      std::allocator<char>::~allocator((allocator<char> *)&local_461);
      std::__cxx11::string::~string(local_440);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar8,"Invalid Operation");
        __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      std::__cxx11::string::string(local_488,local_358);
      std::__cxx11::string::operator+=(local_488,"enabledApiLayerCount");
      std::__cxx11::ostringstream::ostringstream(local_600);
      poVar9 = std::operator<<((ostream *)local_600,"0x");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::hex);
      std::ostream::operator<<(poVar9,info->enabledApiLayerCount);
      std::__cxx11::ostringstream::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)(local_338 + 0x20),(char (*) [9])"uint32_t",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488,
                 local_620);
      std::__cxx11::string::~string((string *)local_620);
      std::__cxx11::string::string(local_640,local_358);
      std::__cxx11::string::operator+=(local_640,"enabledApiLayerNames");
      std::__cxx11::ostringstream::ostringstream(local_7b8);
      poVar9 = std::operator<<((ostream *)local_7b8,"0x");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::hex);
      std::ostream::operator<<(poVar9,info->enabledApiLayerNames);
      std::__cxx11::ostringstream::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[19],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)(local_338 + 0x20),(char (*) [19])"const char* const*",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_640,
                 local_7d8);
      std::__cxx11::string::~string((string *)local_7d8);
      for (local_7dc = 0; local_7dc < info->enabledApiLayerCount; local_7dc = local_7dc + 1) {
        std::operator+(local_840,(char *)local_640);
        std::__cxx11::to_string(local_860,local_7dc);
        std::operator+(local_820,local_840);
        std::operator+(local_800,(char *)local_820);
        std::__cxx11::string::~string((string *)local_820);
        std::__cxx11::string::~string((string *)local_860);
        std::__cxx11::string::~string((string *)local_840);
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[19],std::__cxx11::string&,char_const*const&>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                    *)(local_338 + 0x20),(char (*) [19])"const char* const*",local_800,
                   info->enabledApiLayerNames + local_7dc);
        std::__cxx11::string::~string((string *)local_800);
      }
      std::__cxx11::string::string(local_880,local_358);
      std::__cxx11::string::operator+=(local_880,"enabledExtensionCount");
      std::__cxx11::ostringstream::ostringstream(local_9f8);
      poVar9 = std::operator<<((ostream *)local_9f8,"0x");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::hex);
      std::ostream::operator<<(poVar9,info->enabledExtensionCount);
      std::__cxx11::ostringstream::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)(local_338 + 0x20),(char (*) [9])"uint32_t",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_880,
                 local_a18);
      std::__cxx11::string::~string((string *)local_a18);
      std::__cxx11::string::string(local_a38,local_358);
      std::__cxx11::string::operator+=(local_a38,"enabledExtensionNames");
      std::__cxx11::ostringstream::ostringstream(local_bb0);
      poVar9 = std::operator<<((ostream *)local_bb0,"0x");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::hex);
      std::ostream::operator<<(poVar9,info->enabledExtensionNames);
      std::__cxx11::ostringstream::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[19],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)(local_338 + 0x20),(char (*) [19])"const char* const*",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a38,
                 local_bd0);
      std::__cxx11::string::~string((string *)local_bd0);
      for (local_bd4 = 0; local_bd4 < info->enabledExtensionCount; local_bd4 = local_bd4 + 1) {
        std::operator+(local_c38,(char *)local_a38);
        std::__cxx11::to_string(local_c58,local_bd4);
        std::operator+(local_c18,local_c38);
        std::operator+(local_bf8,(char *)local_c18);
        std::__cxx11::string::~string((string *)local_c18);
        std::__cxx11::string::~string((string *)local_c58);
        std::__cxx11::string::~string((string *)local_c38);
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[19],std::__cxx11::string&,char_const*const&>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                    *)(local_338 + 0x20),(char (*) [19])"const char* const*",local_bf8,
                   info->enabledExtensionNames + local_bd4);
        std::__cxx11::string::~string((string *)local_bf8);
      }
      std::__cxx11::ostringstream::~ostringstream(local_bb0);
      std::__cxx11::string::~string(local_a38);
      std::__cxx11::ostringstream::~ostringstream(local_9f8);
      std::__cxx11::string::~string(local_880);
      std::__cxx11::ostringstream::~ostringstream(local_7b8);
      std::__cxx11::string::~string(local_640);
      std::__cxx11::ostringstream::~ostringstream(local_600);
      std::__cxx11::string::~string(local_488);
      std::__cxx11::string::~string(local_420);
      std::__cxx11::string::~string(local_3e0);
      std::__cxx11::string::~string(local_3a0);
      std::__cxx11::string::~string(local_358);
    }
    PointerToHexString<XrInstance_T*>((XrInstance_T **)local_c78);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[12],char_const(&)[9],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)(local_338 + 0x20),(char (*) [12])"XrInstance*",(char (*) [9])"instance",local_c78
              );
    std::__cxx11::string::~string((string *)local_c78);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&returned_instance,
             (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_338 + 0x20));
    ApiDumpLayerRecordContent
              ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&returned_instance);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&returned_instance);
    memcpy(local_258,apiLayerInfo,0x220);
    new_api_layer_info.settings_file_location._504_8_ = apiLayerInfo->nextInfo->next;
    get_inst_proc_addr = apiLayerInfo->nextInfo->nextGetInstanceProcAddr;
    new_api_layer_info.nextInfo =
         (XrApiLayerNextInfo *)apiLayerInfo->nextInfo->nextCreateApiLayerInstance;
    pXStack_c98 = *instance;
    info_local._4_4_ =
         (*(code *)new_api_layer_info.nextInfo)(info,local_258,&stack0xfffffffffffff368);
    *instance = pXStack_c98;
    table = (XrGeneratedDispatchTable *)operator_new(0xa58);
    memset(table,0,0xa58);
    mlock._8_8_ = table;
    GeneratedXrPopulateDispatchTable(table,pXStack_c98,get_inst_proc_addr);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_cb8,&g_instance_dispatch_mutex);
    uVar5 = mlock._8_8_;
    ppXVar10 = std::
               unordered_map<XrInstance_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_XrGeneratedDispatchTable_*>_>_>
               ::operator[](&g_instance_dispatch_map,&stack0xfffffffffffff368);
    *ppXVar10 = (mapped_type)uVar5;
    contents.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_cb8);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_338 + 0x20));
  }
LAB_00106b44:
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::~string(local_280);
  return info_local._4_4_;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrCreateApiLayerInstance(const XrInstanceCreateInfo *info,
                                                                    const struct XrApiLayerCreateInfo *apiLayerInfo,
                                                                    XrInstance *instance) {
    try {
        PFN_xrGetInstanceProcAddr next_get_instance_proc_addr = nullptr;
        PFN_xrCreateApiLayerInstance next_create_api_layer_instance = nullptr;
        XrApiLayerCreateInfo new_api_layer_info = {};
        bool first_time = !g_record_info.initialized;

        if (!g_record_info.initialized) {
            g_record_info.initialized = true;
            g_record_info.type = RECORD_TEXT_COUT;
        }

#if !defined(ANDROID)
        std::string export_type = PlatformUtilsGetEnv("XR_API_DUMP_EXPORT_TYPE");
        std::string file_name = PlatformUtilsGetEnv("XR_API_DUMP_FILE_NAME");
#else
        // We match the pattern used by the Vulkan api_dump layer here
        // (we replace the `XR_` prefix with `debug.` and make it lowercase.)
        // adb shell "setprop debug.api_dump_file_name '/sdcard/xr_apidump.txt'"
        std::string export_type = PlatformUtilsGetAndroidSystemProperty("debug.api_dump_export_type");
        std::string file_name = PlatformUtilsGetAndroidSystemProperty("debug.api_dump_file_name");
#endif

        if (!file_name.empty()) {
            g_record_info.file_name = file_name;
            g_record_info.type = RECORD_TEXT_FILE;
        }

        if (!export_type.empty()) {
            std::string export_type_lower = export_type;
            std::transform(export_type.begin(), export_type.end(), export_type_lower.begin(),
                           [](unsigned char c) { return std::tolower(c); });

            if (export_type_lower == "text") {
                if (!g_record_info.file_name.empty()) {
                    g_record_info.type = RECORD_TEXT_FILE;
                } else {
                    g_record_info.type = RECORD_TEXT_COUT;
                }
            } else if (export_type_lower == "html" && first_time) {
                g_record_info.type = RECORD_HTML_FILE;
                if (!ApiDumpLayerWriteHtmlHeader()) {
                    return XR_ERROR_INITIALIZATION_FAILED;
                }
            } else if (export_type_lower == "code") {
                g_record_info.type = RECORD_CODE_FILE;
            }
        }

        // Validate the API layer info and next API layer info structures before we try to use them
        if (nullptr == apiLayerInfo || XR_LOADER_INTERFACE_STRUCT_API_LAYER_CREATE_INFO != apiLayerInfo->structType ||
            XR_API_LAYER_CREATE_INFO_STRUCT_VERSION > apiLayerInfo->structVersion ||
            sizeof(XrApiLayerCreateInfo) > apiLayerInfo->structSize || nullptr == apiLayerInfo->nextInfo ||
            XR_LOADER_INTERFACE_STRUCT_API_LAYER_NEXT_INFO != apiLayerInfo->nextInfo->structType ||
            XR_API_LAYER_NEXT_INFO_STRUCT_VERSION > apiLayerInfo->nextInfo->structVersion ||
            sizeof(XrApiLayerNextInfo) > apiLayerInfo->nextInfo->structSize ||
            0 != strcmp("XR_APILAYER_LUNARG_api_dump", apiLayerInfo->nextInfo->layerName) ||
            nullptr == apiLayerInfo->nextInfo->nextGetInstanceProcAddr ||
            nullptr == apiLayerInfo->nextInfo->nextCreateApiLayerInstance) {
            return XR_ERROR_INITIALIZATION_FAILED;
        }

        // Generate output for this command as if it were the standard xrCreateInstance
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        contents.emplace_back("XrResult", "xrCreateInstance", "");
        contents.emplace_back("const XrInstanceCreateInfo*", "info", PointerToHexString(info));
        if (nullptr != info) {
            std::string info_prefix = "info->";
            contents.emplace_back("XrStructureType", "info->type", std::to_string(info->type));
            std::string next_prefix = info_prefix;
            next_prefix += "next";
            // Decode the next chain if it exists
            if (!ApiDumpDecodeNextChain(nullptr, info->next, next_prefix, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
            std::string flags_prefix = info_prefix;
            flags_prefix += "createFlags";
            contents.emplace_back("XrInstanceCreateFlags", flags_prefix, std::to_string(info->createFlags));
            std::string applicationinfo_prefix = info_prefix;
            applicationinfo_prefix += "applicationInfo";
            if (!ApiDumpOutputXrStruct(nullptr, &info->applicationInfo, applicationinfo_prefix, "XrApplicationInfo", true,
                                       contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
            std::string enabledapilayercount_prefix = info_prefix;
            enabledapilayercount_prefix += "enabledApiLayerCount";
            std::ostringstream oss_enabledApiLayerCount;
            oss_enabledApiLayerCount << "0x" << std::hex << (info->enabledApiLayerCount);
            contents.emplace_back("uint32_t", enabledapilayercount_prefix, oss_enabledApiLayerCount.str());
            std::string enabledapilayernames_prefix = info_prefix;
            enabledapilayernames_prefix += "enabledApiLayerNames";
            std::ostringstream oss_enabledApiLayerNames_array;
            oss_enabledApiLayerNames_array << "0x" << std::hex << (info->enabledApiLayerNames);
            contents.emplace_back("const char* const*", enabledapilayernames_prefix, oss_enabledApiLayerNames_array.str());
            for (uint32_t i = 0; i < info->enabledApiLayerCount; ++i) {
                std::string prefix = enabledapilayernames_prefix + "[" + std::to_string(i) + "]";
                contents.emplace_back("const char* const*", prefix, info->enabledApiLayerNames[i]);
            }
            std::string enabledextensioncount_prefix = info_prefix;
            enabledextensioncount_prefix += "enabledExtensionCount";
            std::ostringstream oss_enabledExtensionCount;
            oss_enabledExtensionCount << "0x" << std::hex << (info->enabledExtensionCount);
            contents.emplace_back("uint32_t", enabledextensioncount_prefix, oss_enabledExtensionCount.str());
            std::string enabledextensionnames_prefix = info_prefix;
            enabledextensionnames_prefix += "enabledExtensionNames";
            std::ostringstream oss_enabledExtensionNames_array;
            oss_enabledExtensionNames_array << "0x" << std::hex << (info->enabledExtensionNames);
            contents.emplace_back("const char* const*", enabledextensionnames_prefix, oss_enabledExtensionNames_array.str());
            for (uint32_t ii = 0; ii < info->enabledExtensionCount; ++ii) {
                std::string prefix = enabledextensionnames_prefix + "[" + std::to_string(ii) + "]";
                contents.emplace_back("const char* const*", prefix, info->enabledExtensionNames[ii]);
            }
        }

        contents.emplace_back("XrInstance*", "instance", PointerToHexString(instance));
        ApiDumpLayerRecordContent(contents);

        // Copy the contents of the layer info struct, but then move the next info up by
        // one slot so that the next layer gets information.
        memcpy(&new_api_layer_info, apiLayerInfo, sizeof(XrApiLayerCreateInfo));
        new_api_layer_info.nextInfo = apiLayerInfo->nextInfo->next;

        // Get the function pointers we need
        next_get_instance_proc_addr = apiLayerInfo->nextInfo->nextGetInstanceProcAddr;
        next_create_api_layer_instance = apiLayerInfo->nextInfo->nextCreateApiLayerInstance;

        // Create the instance
        XrInstance returned_instance = *instance;
        XrResult result = next_create_api_layer_instance(info, &new_api_layer_info, &returned_instance);
        *instance = returned_instance;

        // Create the dispatch table to the next levels
        auto *next_dispatch = new XrGeneratedDispatchTable();
        GeneratedXrPopulateDispatchTable(next_dispatch, returned_instance, next_get_instance_proc_addr);

        std::unique_lock<std::mutex> mlock(g_instance_dispatch_mutex);
        g_instance_dispatch_map[returned_instance] = next_dispatch;

        return result;
    } catch (...) {
        return XR_ERROR_INITIALIZATION_FAILED;
    }
}